

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::DumpAddresses(CConnman *this)

{
  bool bVar1;
  long lVar2;
  Logger *this_00;
  long lVar3;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  long local_28;
  size_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = std::chrono::_V2::steady_clock::now();
  DumpPeerAddresses(&gArgs,this->addrman);
  this_00 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar1) {
    local_20 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    lVar3 = std::chrono::_V2::steady_clock::now();
    local_28 = (lVar3 - lVar2) / 1000000;
    logging_function._M_str = "DumpAddresses";
    logging_function._M_len = 0xd;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    LogPrintFormatInternal<unsigned_long,long>
              (logging_function,source_file,0x91a,NET,Debug,(ConstevalFormatString<2U>)0x7d2526,
               &local_20,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::DumpAddresses()
{
    const auto start{SteadyClock::now()};

    DumpPeerAddresses(::gArgs, addrman);

    LogDebug(BCLog::NET, "Flushed %d addresses to peers.dat  %dms\n",
             addrman.Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}